

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>::
AttachmentPromiseNode
          (AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
           *this,OwnPromiseNode *dependency,
          OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachment)

{
  uint uVar1;
  undefined8 uVar2;
  
  AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (&this->super_AttachmentPromiseNodeBase,dependency);
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_006dadb0;
  uVar1 = attachment->tag;
  (this->attachment).tag = uVar1;
  if (uVar1 == 2) {
    *(undefined8 *)((long)&(this->attachment).field_1 + 0x10) =
         *(undefined8 *)((long)&attachment->field_1 + 0x10);
    uVar2 = *(undefined8 *)((long)&attachment->field_1 + 8);
    *(undefined8 *)&(this->attachment).field_1 = *(undefined8 *)&attachment->field_1;
    *(undefined8 *)((long)&(this->attachment).field_1 + 8) = uVar2;
  }
  else if (uVar1 == 1) {
    *(undefined8 *)&(this->attachment).field_1 = *(undefined8 *)&attachment->field_1;
    *(undefined8 *)((long)&(this->attachment).field_1 + 8) =
         *(undefined8 *)((long)&attachment->field_1 + 8);
    *(undefined8 *)((long)&(this->attachment).field_1 + 0x10) =
         *(undefined8 *)((long)&attachment->field_1 + 0x10);
    *(undefined8 *)&attachment->field_1 = 0;
    *(undefined8 *)((long)&attachment->field_1 + 8) = 0;
  }
  return;
}

Assistant:

AttachmentPromiseNode(OwnPromiseNode&& dependency, Attachment&& attachment)
      : AttachmentPromiseNodeBase(kj::mv(dependency)),
        attachment(kj::mv<Attachment>(attachment)) {}